

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_>::Data
          (Data<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *this,
          Data<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *other,size_t reserved)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  pair<int,_int> *ppVar4;
  long in_RSI;
  Span<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar5;
  size_t otherNSpans;
  Node<std::pair<int,_int>,_QTextCharFormat> *newNode;
  Node<std::pair<int,_int>,_QTextCharFormat> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *this_00;
  pair<int,_int> *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  pair<int,_int> *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  *(undefined8 *)((pair<int,_int> *)in_RDI->offsets + 1) = *(undefined8 *)(in_RSI + 8);
  ((pair<int,_int> *)in_RDI->offsets)[2] = (pair<int,_int>)0x0;
  ((pair<int,_int> *)in_RDI->offsets)[3] = (pair<int,_int>)*(undefined8 *)(in_RSI + 0x18);
  ((pair<int,_int> *)in_RDI->offsets)[4] = (pair<int,_int>)0x0;
  qMax<unsigned_long>((unsigned_long *)((pair<int,_int> *)in_RDI->offsets + 1),&local_20);
  sVar3 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  ((pair<int,_int> *)in_RDI->offsets)[2] = (pair<int,_int>)sVar3;
  RVar5 = allocateSpans(in_stack_ffffffffffffffb0);
  ((pair<int,_int> *)in_RDI->offsets)[4] = (pair<int,_int>)RVar5.spans;
  ppVar4 = (pair<int,_int> *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = ppVar4;
  for (local_40 = (pair<int,_int> *)0x0; local_40 < ppVar4;
      local_40 = (pair<int,_int> *)((long)&local_40->first + 1)) {
    lVar1 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar2 = Span<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_>::hasNode
                        ((Span<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *)
                         (lVar1 + (long)local_40 * 0x90),i);
      if (bVar2) {
        Span<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_>::at(this_00,(size_t)in_RDI);
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18 = Data<QHashPrivate::Node<std::pair<int,int>,QTextCharFormat>>::
                   findBucket<std::pair<int,int>>
                             ((Data<QHashPrivate::Node<std::pair<int,_int>,_QTextCharFormat>_> *)
                              RVar5.spans,key);
        Bucket::insert((Bucket *)0x136237);
        Node<std::pair<int,_int>,_QTextCharFormat>::Node
                  ((Node<std::pair<int,_int>,_QTextCharFormat> *)this_00,
                   (Node<std::pair<int,_int>,_QTextCharFormat> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }